

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdFreeCombinePubkeyHandle(void *handle,void *combine_handle)

{
  void *pvVar1;
  void *in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiCombinePubkey *combine_struct;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [20];
  uint32_t in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  
  cfd::Initialize();
  if ((in_RSI != (void *)0x0) &&
     (in_stack_ffffffffffffffd0 = in_RSI, *(long *)((long)in_RSI + 0x10) != 0)) {
    pvVar1 = *(void **)((long)in_RSI + 0x10);
    if (pvVar1 != (void *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_ffffffffffffff80);
      operator_delete(pvVar1);
    }
    *(undefined8 *)((long)in_RSI + 0x10) = 0;
    in_stack_ffffffffffffffd0 = in_RSI;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"CombinePubkey",&local_51);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

int CfdFreeCombinePubkeyHandle(void* handle, void* combine_handle) {
  try {
    cfd::Initialize();
    if (combine_handle != nullptr) {
      CfdCapiCombinePubkey* combine_struct =
          static_cast<CfdCapiCombinePubkey*>(combine_handle);
      if (combine_struct->pubkey_list != nullptr) {
        delete combine_struct->pubkey_list;
        combine_struct->pubkey_list = nullptr;
      }
    }
    FreeBuffer(
        combine_handle, kPrefixCombinePubkey, sizeof(CfdCapiCombinePubkey));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}